

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O2

ValueArray<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>
* __thiscall
testing::
Values<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>
          (FlatTupleBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul,24ul,25ul,26ul,27ul,28ul,29ul,30ul,31ul,32ul,33ul,34ul,35ul,36ul,37ul,38ul,39ul,40ul,41ul,42ul,43ul,44ul,45ul,46ul,47ul,48ul,49ul>>
           *__return_storage_ptr__,testing *this,undefined4 *v,undefined4 *v_1,undefined4 *v_2,
          undefined4 *v_3,undefined4 *v_4,undefined4 *v_5,undefined4 *param_9,undefined4 *v_6,
          undefined4 *param_11,undefined4 *v_7,undefined4 *param_13,undefined4 *v_8,
          undefined4 *param_15,undefined4 *v_9,undefined4 *param_17,undefined4 *v_10,
          undefined4 *param_19,undefined4 *v_11,undefined4 *param_21,undefined4 *v_12,
          undefined4 *param_23,undefined4 *v_13,undefined4 *param_25,undefined4 *v_14,
          undefined4 *param_27,undefined4 *v_15,undefined4 *param_29,undefined4 *v_16,
          undefined4 *param_31,undefined4 *v_17,undefined4 *param_33,undefined4 *v_18,
          undefined4 *param_35,undefined4 *v_19,undefined4 *param_37,undefined4 *v_20,
          undefined4 *param_39,undefined4 *v_21,undefined4 *param_41,undefined4 *v_22,
          undefined4 *param_43,undefined4 *v_23,undefined4 *param_45,undefined4 *v_24,
          undefined4 *param_47,undefined4 *v_25,undefined4 *param_49,undefined4 *v_26,
          undefined4 *param_51)

{
  undefined4 local_348 [2];
  undefined8 local_340;
  undefined4 local_338 [2];
  undefined8 local_330;
  undefined4 local_328 [2];
  undefined8 local_320;
  undefined4 local_318 [2];
  undefined8 local_310;
  undefined4 local_308 [2];
  undefined8 local_300;
  undefined4 local_2f8 [2];
  undefined8 local_2f0;
  undefined4 local_2e8 [2];
  undefined8 local_2e0;
  undefined4 local_2d8 [2];
  undefined8 local_2d0;
  undefined4 local_2c8 [2];
  undefined8 local_2c0;
  undefined4 local_2b8 [2];
  undefined8 local_2b0;
  undefined4 local_2a8 [2];
  undefined8 local_2a0;
  undefined4 local_298 [2];
  undefined8 local_290;
  undefined4 local_288 [2];
  undefined8 local_280;
  undefined4 local_278 [2];
  undefined8 local_270;
  undefined4 local_268 [2];
  undefined8 local_260;
  undefined4 local_258 [2];
  undefined8 local_250;
  undefined4 local_248 [2];
  undefined8 local_240;
  undefined4 local_238 [2];
  undefined8 local_230;
  undefined4 local_228 [2];
  undefined8 local_220;
  undefined4 local_218 [2];
  undefined8 local_210;
  undefined4 local_208 [2];
  undefined8 local_200;
  undefined4 local_1f8 [2];
  undefined8 local_1f0;
  undefined4 local_1e8 [2];
  undefined8 local_1e0;
  undefined4 local_1d8 [2];
  undefined8 local_1d0;
  undefined4 local_1c8 [2];
  undefined8 local_1c0;
  undefined4 local_1b8 [2];
  undefined8 local_1b0;
  undefined4 local_1a8 [2];
  undefined8 local_1a0;
  undefined4 local_198 [2];
  undefined8 local_190;
  undefined4 local_188 [2];
  undefined8 local_180;
  undefined4 local_178 [2];
  undefined8 local_170;
  undefined4 local_168 [2];
  undefined8 local_160;
  undefined4 local_158 [2];
  undefined8 local_150;
  undefined4 local_148 [2];
  undefined8 local_140;
  undefined4 local_138 [2];
  undefined8 local_130;
  undefined4 local_128 [2];
  undefined8 local_120;
  undefined4 local_118 [2];
  undefined8 local_110;
  undefined4 local_108 [2];
  undefined8 local_100;
  undefined4 local_f8 [2];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined4 local_e0 [2];
  undefined8 local_d8;
  undefined4 local_d0 [2];
  undefined8 local_c8;
  undefined4 local_c0 [2];
  undefined8 local_b8;
  undefined4 local_b0 [2];
  undefined8 local_a8;
  undefined4 local_a0 [2];
  undefined8 local_98;
  undefined4 local_90 [2];
  undefined8 local_88;
  undefined4 local_80 [2];
  undefined8 local_78;
  undefined4 local_70 [2];
  undefined8 local_68;
  undefined4 local_60 [2];
  undefined8 local_58;
  undefined4 local_50 [2];
  undefined8 local_48;
  undefined4 local_40 [2];
  undefined8 local_38;
  
  local_e8 = *(undefined8 *)this;
  local_40[0] = *v;
  local_38 = *(undefined8 *)(v + 2);
  local_f8[0] = *v_1;
  local_f0 = *(undefined8 *)(v_1 + 2);
  local_50[0] = *v_2;
  local_48 = *(undefined8 *)(v_2 + 2);
  local_60[0] = *v_3;
  local_58 = *(undefined8 *)(v_3 + 2);
  local_108[0] = *v_4;
  local_100 = *(undefined8 *)(v_4 + 2);
  local_118[0] = *v_5;
  local_110 = *(undefined8 *)(v_5 + 2);
  local_128[0] = *param_9;
  local_120 = *(undefined8 *)(param_9 + 2);
  local_138[0] = *v_6;
  local_130 = *(undefined8 *)(v_6 + 2);
  local_148[0] = *param_11;
  local_140 = *(undefined8 *)(param_11 + 2);
  local_158[0] = *v_7;
  local_150 = *(undefined8 *)(v_7 + 2);
  local_168[0] = *param_13;
  local_160 = *(undefined8 *)(param_13 + 2);
  local_178[0] = *v_8;
  local_170 = *(undefined8 *)(v_8 + 2);
  local_188[0] = *param_15;
  local_180 = *(undefined8 *)(param_15 + 2);
  local_198[0] = *v_9;
  local_190 = *(undefined8 *)(v_9 + 2);
  local_1a8[0] = *param_17;
  local_1a0 = *(undefined8 *)(param_17 + 2);
  local_1b8[0] = *v_10;
  local_1b0 = *(undefined8 *)(v_10 + 2);
  local_1c8[0] = *param_19;
  local_1c0 = *(undefined8 *)(param_19 + 2);
  local_1d8[0] = *v_11;
  local_1d0 = *(undefined8 *)(v_11 + 2);
  local_1e8[0] = *param_21;
  local_1e0 = *(undefined8 *)(param_21 + 2);
  local_1f8[0] = *v_12;
  local_1f0 = *(undefined8 *)(v_12 + 2);
  local_208[0] = *param_23;
  local_200 = *(undefined8 *)(param_23 + 2);
  local_218[0] = *v_13;
  local_210 = *(undefined8 *)(v_13 + 2);
  local_228[0] = *param_25;
  local_220 = *(undefined8 *)(param_25 + 2);
  local_238[0] = *v_14;
  local_230 = *(undefined8 *)(v_14 + 2);
  local_248[0] = *param_27;
  local_240 = *(undefined8 *)(param_27 + 2);
  local_258[0] = *v_15;
  local_250 = *(undefined8 *)(v_15 + 2);
  local_268[0] = *param_29;
  local_260 = *(undefined8 *)(param_29 + 2);
  local_278[0] = *v_16;
  local_270 = *(undefined8 *)(v_16 + 2);
  local_288[0] = *param_31;
  local_280 = *(undefined8 *)(param_31 + 2);
  local_298[0] = *v_17;
  local_290 = *(undefined8 *)(v_17 + 2);
  local_2a8[0] = *param_33;
  local_2a0 = *(undefined8 *)(param_33 + 2);
  local_2b8[0] = *v_18;
  local_2b0 = *(undefined8 *)(v_18 + 2);
  local_2c8[0] = *param_35;
  local_2c0 = *(undefined8 *)(param_35 + 2);
  local_2d8[0] = *v_19;
  local_2d0 = *(undefined8 *)(v_19 + 2);
  local_2e8[0] = *param_37;
  local_2e0 = *(undefined8 *)(param_37 + 2);
  local_2f8[0] = *v_20;
  local_2f0 = *(undefined8 *)(v_20 + 2);
  local_308[0] = *param_39;
  local_300 = *(undefined8 *)(param_39 + 2);
  local_318[0] = *v_21;
  local_310 = *(undefined8 *)(v_21 + 2);
  local_328[0] = *param_41;
  local_320 = *(undefined8 *)(param_41 + 2);
  local_338[0] = *v_22;
  local_330 = *(undefined8 *)(v_22 + 2);
  local_348[0] = *param_43;
  local_340 = *(undefined8 *)(param_43 + 2);
  local_70[0] = *v_23;
  local_68 = *(undefined8 *)(v_23 + 2);
  local_80[0] = *param_45;
  local_78 = *(undefined8 *)(param_45 + 2);
  local_90[0] = *v_24;
  local_88 = *(undefined8 *)(v_24 + 2);
  local_a0[0] = *param_47;
  local_98 = *(undefined8 *)(param_47 + 2);
  local_b0[0] = *v_25;
  local_a8 = *(undefined8 *)(v_25 + 2);
  local_c0[0] = *param_49;
  local_b8 = *(undefined8 *)(param_49 + 2);
  local_d0[0] = *v_26;
  local_c8 = *(undefined8 *)(v_26 + 2);
  local_e0[0] = *param_51;
  local_d8 = *(undefined8 *)(param_51 + 2);
  internal::
  FlatTupleBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul,24ul,25ul,26ul,27ul,28ul,29ul,30ul,31ul,32ul,33ul,34ul,35ul,36ul,37ul,38ul,39ul,40ul,41ul,42ul,43ul,44ul,45ul,46ul,47ul,48ul,49ul>>
  ::
  FlatTupleBase<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>
            (__return_storage_ptr__,&local_e8,local_40,local_f8,local_50,local_60,local_108,
             local_118,local_128,local_138,local_148,local_158,local_168,local_178,local_188,
             local_198,local_1a8,local_1b8,local_1c8,local_1d8,local_1e8,local_1f8,local_208,
             local_218,local_228,local_238,local_248,local_258,local_268,local_278,local_288,
             local_298,local_2a8,local_2b8,local_2c8,local_2d8,local_2e8,local_2f8,local_308,
             local_318,local_328,local_338,local_348,local_70,local_80,local_90,local_a0,local_b0,
             local_c0,local_d0,local_e0);
  return (ValueArray<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>
          *)__return_storage_ptr__;
}

Assistant:

internal::ValueArray<T...> Values(T... v) {
  return internal::ValueArray<T...>(std::move(v)...);
}